

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

_Bool parse_optional(gravity_parser_t *parser,gtoken_t token)

{
  gravity_lexer_t *lexer;
  _Bool _Var1;
  gtoken_t token_00;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  token_00 = gravity_lexer_peek(lexer);
  _Var1 = token_iserror(token_00);
  if (_Var1) {
    parse_error(parser);
    token_00 = gravity_lexer_peek(lexer);
  }
  if (token_00 == token) {
    gravity_lexer_next(lexer);
  }
  return token_00 == token;
}

Assistant:

static bool parse_optional (gravity_parser_t *parser, gtoken_t token) {
    DECLARE_LEXER;

    gtoken_t peek = gravity_lexer_peek(lexer);
    if (token_iserror(peek)) {
        parse_error(parser);
        peek = gravity_lexer_peek(lexer);
    }

    if (peek == token) {
        gravity_lexer_next(lexer); // consume expected token
        return true;
    }

    // do not report any error in this case
    return false;
}